

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void __thiscall
Fl_Window_Type::newposition(Fl_Window_Type *this,Fl_Widget_Type *myo,int *X,int *Y,int *R,int *T)

{
  uint uVar1;
  Fl_Widget *pFVar2;
  int iVar3;
  int iVar4;
  
  pFVar2 = myo->o;
  *X = pFVar2->x_;
  *Y = pFVar2->y_;
  *R = pFVar2->w_ + *X;
  *T = pFVar2->h_ + *Y;
  uVar1 = this->drag;
  if (uVar1 == 0) {
    return;
  }
  if ((uVar1 & 0x10) == 0) {
    if ((uVar1 & 1) != 0) {
      iVar4 = *X;
      if (iVar4 == this->bx) {
        iVar3 = this->dx + iVar4;
      }
      else {
        iVar3 = this->dx + this->bx;
        if (iVar3 <= iVar4) goto LAB_0018e73d;
      }
      *X = iVar3;
    }
LAB_0018e73d:
    if ((this->drag & 8) != 0) {
      iVar4 = *Y;
      if (iVar4 == this->by) {
        iVar3 = this->dy + iVar4;
      }
      else {
        iVar3 = this->dy + this->by;
        if (iVar3 <= iVar4) goto LAB_0018e767;
      }
      *Y = iVar3;
    }
LAB_0018e767:
    if ((this->drag & 2) != 0) {
      iVar4 = *R;
      if (iVar4 == this->br) {
        iVar3 = this->dx + iVar4;
      }
      else {
        iVar3 = this->dx + this->br;
        if (iVar4 <= iVar3) goto LAB_0018e793;
      }
      *R = iVar3;
    }
LAB_0018e793:
    if ((this->drag & 4) == 0) goto LAB_0018e79c;
    iVar3 = *T;
    if (iVar3 == this->bt) {
      iVar4 = iVar3 + this->dy;
    }
    else {
      iVar4 = this->bt + this->dx;
      if (iVar3 <= iVar4) goto LAB_0018e79c;
    }
  }
  else {
    *X = *X + this->dx;
    *Y = *Y + this->dy;
    *R = *R + this->dx;
    iVar4 = *T + this->dy;
  }
  *T = iVar4;
LAB_0018e79c:
  iVar4 = *X;
  if (*R < iVar4) {
    *X = *R;
    *R = iVar4;
  }
  iVar4 = *Y;
  if (*T < iVar4) {
    *Y = *T;
    *T = iVar4;
  }
  return;
}

Assistant:

void Fl_Window_Type::newposition(Fl_Widget_Type *myo,int &X,int &Y,int &R,int &T) {
  X = myo->o->x();
  Y = myo->o->y();
  R = X+myo->o->w();
  T = Y+myo->o->h();
  if (!drag) return;
  if (drag&DRAG) {
    X += dx;
    Y += dy;
    R += dx;
    T += dy;
  } else {
    if (drag&LEFT) {
      if (X==bx) {
        X += dx; 
      } else {
        if (X<bx+dx) X = bx+dx;
      }
    }
    if (drag&TOP) {
      if (Y==by) {
        Y += dy;
      } else {
        if (Y<by+dy) Y = by+dy;
      }
    }
    if (drag&RIGHT) {
      if (R==br) {
        R += dx; 
      } else {
        if (R>br+dx) R = br+dx;
      }
    }
    if (drag&BOTTOM) {
      if (T==bt) {
        T += dy; 
      } else {
        if (T>bt+dx) T = bt+dx;
      }
    }
  }
  if (R<X) {int n = X; X = R; R = n;}
  if (T<Y) {int n = Y; Y = T; T = n;}
}